

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_marker(stbi__jpeg *z,int m)

{
  uint uVar1;
  stbi__context *psVar2;
  byte *pbVar3;
  uchar *puVar4;
  byte bVar5;
  stbi_uc sVar6;
  uchar uVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  stbi_uc *psVar12;
  int i;
  int i_1;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  byte bVar19;
  int ok;
  bool bVar20;
  int sizes [16];
  uint local_78 [18];
  int iVar11;
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      uVar10 = stbi__get16be(z->s);
      iVar18 = uVar10 - 2;
      if (2 < uVar10) {
        do {
          psVar2 = z->s;
          pbVar3 = psVar2->img_buffer;
          if (pbVar3 < psVar2->img_buffer_end) {
            psVar2->img_buffer = pbVar3 + 1;
            bVar8 = *pbVar3;
          }
          else if (psVar2->read_from_callbacks == 0) {
            bVar8 = 0;
          }
          else {
            psVar12 = psVar2->buffer_start;
            iVar11 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
            if (iVar11 == 0) {
              psVar2->read_from_callbacks = 0;
              psVar12 = psVar2->buffer_start + 1;
              psVar2->buffer_start[0] = '\0';
              bVar8 = 0;
            }
            else {
              bVar8 = *psVar12;
              psVar12 = psVar12 + iVar11;
            }
            psVar2->img_buffer_end = psVar12;
            psVar2->img_buffer = psVar2->buffer_start + 1;
          }
          if ((0x1f < bVar8) || (bVar19 = bVar8 & 0xf, 3 < bVar19)) {
            stbi__g_failure_reason = "bad DHT header";
            goto LAB_0016cd61;
          }
          lVar13 = 0;
          uVar10 = 0;
          do {
            psVar2 = z->s;
            pbVar3 = psVar2->img_buffer;
            if (pbVar3 < psVar2->img_buffer_end) {
              psVar2->img_buffer = pbVar3 + 1;
              bVar5 = *pbVar3;
            }
            else if (psVar2->read_from_callbacks == 0) {
              bVar5 = 0;
            }
            else {
              psVar12 = psVar2->buffer_start;
              iVar11 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
              if (iVar11 == 0) {
                psVar2->read_from_callbacks = 0;
                psVar12 = psVar2->buffer_start + 1;
                psVar2->buffer_start[0] = '\0';
                bVar5 = 0;
              }
              else {
                bVar5 = *psVar12;
                psVar12 = psVar12 + iVar11;
              }
              psVar2->img_buffer_end = psVar12;
              psVar2->img_buffer = psVar2->buffer_start + 1;
            }
            local_78[lVar13] = (uint)bVar5;
            uVar10 = uVar10 + bVar5;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x10);
          if (bVar8 < 0x10) {
            iVar11 = stbi__build_huffman(z->huff_dc + bVar19,(int *)local_78);
            lVar13 = 8;
          }
          else {
            iVar11 = stbi__build_huffman(z->huff_ac + bVar19,(int *)local_78);
            lVar13 = 0x1a48;
          }
          if (iVar11 == 0) goto LAB_0016cd61;
          if (uVar10 != 0) {
            uVar14 = 0;
            do {
              psVar2 = z->s;
              psVar12 = psVar2->img_buffer;
              if (psVar12 < psVar2->img_buffer_end) {
                psVar2->img_buffer = psVar12 + 1;
                sVar6 = *psVar12;
              }
              else if (psVar2->read_from_callbacks == 0) {
                sVar6 = '\0';
              }
              else {
                psVar12 = psVar2->buffer_start;
                iVar11 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
                if (iVar11 == 0) {
                  psVar2->read_from_callbacks = 0;
                  psVar12 = psVar2->buffer_start + 1;
                  psVar2->buffer_start[0] = '\0';
                  sVar6 = '\0';
                }
                else {
                  sVar6 = *psVar12;
                  psVar12 = psVar12 + iVar11;
                }
                psVar2->img_buffer_end = psVar12;
                psVar2->img_buffer = psVar2->buffer_start + 1;
              }
              z->huff_dc[bVar19].values[uVar14 + lVar13 + -8] = sVar6;
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
          }
          if (0xf < bVar8) {
            lVar13 = 0;
            do {
              uVar14 = (ulong)z->huff_ac[bVar19].fast[lVar13];
              z->fast_ac[bVar19][lVar13] = 0;
              if (uVar14 != 0xff) {
                bVar8 = z->huff_ac[bVar19].values[uVar14];
                uVar15 = bVar8 & 0xf;
                if ((bVar8 & 0xf) != 0) {
                  uVar16 = (uint)z->huff_ac[bVar19].size[uVar14];
                  uVar1 = uVar15 + uVar16;
                  if (uVar1 < 10) {
                    uVar17 = (int)lVar13 << (uVar16 & 0x1f) & 0x1ff;
                    uVar16 = -1 << uVar15 | 1;
                    if (0xff < uVar17) {
                      uVar16 = 0;
                    }
                    iVar11 = uVar16 + (uVar17 >> ((byte)(9 - (char)uVar15) & 0x1f));
                    if ((char)iVar11 == iVar11) {
                      z->fast_ac[bVar19][lVar13] =
                           (short)iVar11 * 0x100 | bVar8 & 0xfff0 | (ushort)uVar1;
                    }
                  }
                }
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0x200);
          }
          iVar18 = (iVar18 + -0x11) - uVar10;
        } while (0 < iVar18);
      }
    }
    else {
      if (m != 0xdb) {
LAB_0016c8b5:
        if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
          uVar10 = stbi__get16be(z->s);
          if (1 < uVar10) {
            if (uVar10 < 7 || m != 0xe0) {
              if (uVar10 < 0xe || m != 0xee) {
                iVar18 = uVar10 - 2;
              }
              else {
                bVar20 = true;
                lVar13 = 0;
                do {
                  psVar2 = z->s;
                  puVar4 = psVar2->img_buffer;
                  if (puVar4 < psVar2->img_buffer_end) {
                    psVar2->img_buffer = puVar4 + 1;
                    uVar7 = *puVar4;
                  }
                  else if (psVar2->read_from_callbacks == 0) {
                    uVar7 = '\0';
                  }
                  else {
                    psVar12 = psVar2->buffer_start;
                    iVar18 = (*(psVar2->io).read)
                                       (psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
                    if (iVar18 == 0) {
                      psVar2->read_from_callbacks = 0;
                      psVar12 = psVar2->buffer_start + 1;
                      psVar2->buffer_start[0] = '\0';
                      uVar7 = '\0';
                    }
                    else {
                      uVar7 = *psVar12;
                      psVar12 = psVar12 + iVar18;
                    }
                    psVar2->img_buffer_end = psVar12;
                    psVar2->img_buffer = psVar2->buffer_start + 1;
                  }
                  if (uVar7 != "Adobe"[lVar13]) {
                    bVar20 = false;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 6);
                if (bVar20) {
                  stbi__get8(z->s);
                  stbi__get16be(z->s);
                  stbi__get16be(z->s);
                  bVar8 = stbi__get8(z->s);
                  z->app14_color_transform = (uint)bVar8;
                  iVar18 = uVar10 - 0xe;
                }
                else {
                  iVar18 = uVar10 - 8;
                }
              }
            }
            else {
              bVar20 = true;
              lVar13 = 0;
              do {
                psVar2 = z->s;
                puVar4 = psVar2->img_buffer;
                if (puVar4 < psVar2->img_buffer_end) {
                  psVar2->img_buffer = puVar4 + 1;
                  uVar7 = *puVar4;
                }
                else if (psVar2->read_from_callbacks == 0) {
                  uVar7 = '\0';
                }
                else {
                  psVar12 = psVar2->buffer_start;
                  iVar18 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen)
                  ;
                  if (iVar18 == 0) {
                    psVar2->read_from_callbacks = 0;
                    psVar12 = psVar2->buffer_start + 1;
                    psVar2->buffer_start[0] = '\0';
                    uVar7 = '\0';
                  }
                  else {
                    uVar7 = *psVar12;
                    psVar12 = psVar12 + iVar18;
                  }
                  psVar2->img_buffer_end = psVar12;
                  psVar2->img_buffer = psVar2->buffer_start + 1;
                }
                if (uVar7 != "JFIF"[lVar13]) {
                  bVar20 = false;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 != 5);
              iVar18 = uVar10 - 7;
              if (bVar20) {
                z->jfif = 1;
              }
            }
            stbi__skip(z->s,iVar18);
            goto LAB_0016ce6b;
          }
          if (m == 0xfe) {
            stbi__g_failure_reason = "bad COM len";
          }
          else {
            stbi__g_failure_reason = "bad APP len";
          }
        }
        else {
          stbi__g_failure_reason = "unknown marker";
        }
        goto LAB_0016cd61;
      }
      uVar10 = stbi__get16be(z->s);
      iVar18 = uVar10 - 2;
      if (2 < uVar10) {
        do {
          psVar2 = z->s;
          pbVar3 = psVar2->img_buffer;
          if (pbVar3 < psVar2->img_buffer_end) {
            psVar2->img_buffer = pbVar3 + 1;
            bVar8 = *pbVar3;
LAB_0016c780:
            bVar20 = 0xf < bVar8;
            if ((bVar8 & 0xfffffff0) != 0x10 && bVar20) {
              stbi__g_failure_reason = "bad DQT type";
              goto LAB_0016cd61;
            }
            uVar10 = bVar8 & 0xf;
            if (3 < uVar10) {
              stbi__g_failure_reason = "bad DQT table";
              goto LAB_0016cd61;
            }
          }
          else {
            if (psVar2->read_from_callbacks != 0) {
              psVar12 = psVar2->buffer_start;
              iVar11 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
              if (iVar11 == 0) {
                psVar2->read_from_callbacks = 0;
                psVar12 = psVar2->buffer_start + 1;
                psVar2->buffer_start[0] = '\0';
                bVar8 = 0;
              }
              else {
                bVar8 = *psVar12;
                psVar12 = psVar12 + iVar11;
              }
              psVar2->img_buffer_end = psVar12;
              psVar2->img_buffer = psVar2->buffer_start + 1;
              goto LAB_0016c780;
            }
            bVar20 = false;
            uVar10 = 0;
          }
          lVar13 = 0;
          do {
            psVar2 = z->s;
            if (bVar20 == false) {
              pbVar3 = psVar2->img_buffer;
              if (pbVar3 < psVar2->img_buffer_end) {
                psVar2->img_buffer = pbVar3 + 1;
                bVar8 = *pbVar3;
              }
              else if (psVar2->read_from_callbacks == 0) {
                bVar8 = 0;
              }
              else {
                psVar12 = psVar2->buffer_start;
                iVar11 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar12,psVar2->buflen);
                if (iVar11 == 0) {
                  psVar2->read_from_callbacks = 0;
                  psVar12 = psVar2->buffer_start + 1;
                  psVar2->buffer_start[0] = '\0';
                  bVar8 = 0;
                }
                else {
                  bVar8 = *psVar12;
                  psVar12 = psVar12 + iVar11;
                }
                psVar2->img_buffer_end = psVar12;
                psVar2->img_buffer = psVar2->buffer_start + 1;
              }
              uVar9 = (ushort)bVar8;
            }
            else {
              iVar11 = stbi__get16be(psVar2);
              uVar9 = (ushort)iVar11;
            }
            pbVar3 = "" + lVar13;
            lVar13 = lVar13 + 1;
            *(ushort *)((long)z->dequant[0] + (ulong)*pbVar3 * 2 + (ulong)(uVar10 << 7)) = uVar9;
          } while (lVar13 != 0x40);
          iVar18 = (uint)(bVar20 ^ 1) * 0x40 + -0x81 + iVar18;
        } while (0 < iVar18);
      }
    }
    bVar20 = iVar18 == 0;
  }
  else {
    if (m == 0xdd) {
      iVar18 = stbi__get16be(z->s);
      if (iVar18 == 4) {
        iVar18 = stbi__get16be(z->s);
        z->restart_interval = iVar18;
LAB_0016ce6b:
        bVar20 = true;
        goto LAB_0016ce6d;
      }
      stbi__g_failure_reason = "bad DRI len";
    }
    else {
      if (m != 0xff) goto LAB_0016c8b5;
      stbi__g_failure_reason = "expected marker";
    }
LAB_0016cd61:
    bVar20 = false;
  }
LAB_0016ce6d:
  return (int)bVar20;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}